

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_dupi_vec_s390x(TCGContext_conflict12 *tcg_ctx,uint vece,TCGv_vec r,uint64_t a)

{
  uint uVar1;
  uint64_t uVar2;
  TCGOp *pTVar3;
  uintptr_t o;
  
  uVar2 = dup_const_func_s390x(vece,a);
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar3 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_dupi_vec);
  *(uint *)pTVar3 = (*(uint *)pTVar3 & 0xffff00ff) + ((uVar1 >> 8) + 0xe00 & 0xf00) + 0x3000;
  pTVar3->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar3->args[1] = uVar2;
  return;
}

Assistant:

void tcg_gen_dupi_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, uint64_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(vece, a));
}